

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O1

size_t asmjit::v1_14::VirtMem::detectLargePageSize(void)

{
  ulong uVar1;
  Error EVar2;
  ulong uVar3;
  undefined1 *puVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  StringTmp<128UL> storage;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined1 *puStack_a0;
  undefined1 local_98 [144];
  
  puStack_a0 = local_98;
  uStack_b0 = 0;
  local_b8 = 0x20;
  local_a8 = 0x87;
  local_98[0] = 0;
  EVar2 = OSUtils::readFile("/sys/kernel/mm/transparent_hugepage/hpage_pmd_size",(String *)&local_b8
                            ,0x10);
  if (EVar2 == 0) {
    uVar3 = local_b8 & 0xff;
    if (0x1e < (local_b8 & 0xff)) {
      uVar3 = uStack_b0;
    }
    if (uVar3 != 0) {
      puVar4 = puStack_a0;
      if ((byte)local_b8._0_1_ < 0x1f) {
        puVar4 = (undefined1 *)((long)&local_b8 + 1);
      }
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar1 = (ulong)((byte)puVar4[lVar5] - 0x30) + uVar6 * 10;
        if (9 < (byte)puVar4[lVar5] - 0x30) break;
        bVar7 = uVar3 - 1 != lVar5;
        lVar5 = lVar5 + 1;
        uVar6 = uVar1;
      } while (bVar7);
      if (uVar6 != 0) {
        uVar3 = 0;
        if ((uVar6 & uVar6 - 1) == 0) {
          uVar3 = uVar6;
        }
        goto LAB_0012c0b7;
      }
    }
  }
  uVar3 = 0;
LAB_0012c0b7:
  String::reset((String *)&local_b8);
  return uVar3;
}

Assistant:

static size_t detectLargePageSize() noexcept {
#if defined(__APPLE__) && defined(VM_FLAGS_SUPERPAGE_SIZE_2MB) && ASMJIT_ARCH_X86
  return 2u * 1024u * 1024u;
#elif defined(__FreeBSD__)
  Support::Array<size_t, 2> pageSize;
  // TODO: Does it return unsigned?
  return (getpagesizes(pageSize.data(), 2) < 2) ? 0 : uint32_t(pageSize[1]);
#elif defined(__linux__)
  StringTmp<128> storage;
  if (OSUtils::readFile("/sys/kernel/mm/transparent_hugepage/hpage_pmd_size", storage, 16) != kErrorOk || storage.empty())
    return 0u;

  // The first value should be the size of the page (hpage_pmd_size).
  size_t largePageSize = 0;

  const char* buf = storage.data();
  size_t bufSize = storage.size();

  for (size_t i = 0; i < bufSize; i++) {
    uint32_t digit = uint32_t(uint8_t(buf[i]) - uint8_t('0'));
    if (digit >= 10u)
      break;
    largePageSize = largePageSize * 10 + digit;
  }

  if (Support::isPowerOf2(largePageSize))
    return largePageSize;
  else
    return 0u;
#else
  return 0u;
#endif
}